

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::dropToLog(TranslateToFuzzReader *this,Function *func)

{
  bool bVar1;
  Expression **ppEVar2;
  undefined1 auStack_108 [8];
  Modder modder;
  
  bVar1 = Random::oneIn(&this->random,2);
  if (!bVar1) {
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.currModule = this->wasm;
    auStack_108 = (undefined1  [8])0x0;
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep = (Expression **)0x0;
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.fixed._M_elems[9].currp =
         (Expression **)0x0;
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.currFunction = (Function *)0x0;
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    modder.wasm = (Module *)this;
    Walker<Modder,_wasm::Visitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::Visitor<Modder,_void>_> *)auStack_108,
               PostWalker<Modder,_wasm::Visitor<Modder,_void>_>::scan,&func->body);
    while( true ) {
      if (((long)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                 super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                 super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.fixed._M_elems[9].currp >>
          4) + (long)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep == 0) break;
      if ((pointer)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                   super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.fixed._M_elems[9].currp
          == modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
             super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start) {
        if (modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
            super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Modder, wasm::Visitor<Modder>>::Task, 10>::back() [T = wasm::Walker<Modder, wasm::Visitor<Modder>>::Task, N = 10]"
                       );
        }
        ppEVar2 = modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                  super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.fixed._M_elems
                  [(long)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                         super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep + -2].currp;
        auStack_108 = (undefined1  [8])
                      modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                      super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.fixed._M_elems
                      [(long)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                             super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep + -1].func;
        modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep =
             (Expression **)
             ((long)modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                    super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.replacep + -1);
      }
      else {
        ppEVar2 = (Expression **)
                  modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                  super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
                  super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_108 = (undefined1  [8])
                      modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
                      super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             modder.super_PostWalker<Modder,_wasm::Visitor<Modder,_void>_>.
             super_Walker<Modder,_wasm::Visitor<Modder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::Visitor<Modder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_108 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Modder, wasm::Visitor<Modder>>::walk(Expression *&) [SubType = Modder, VisitorType = wasm::Visitor<Modder>]"
                     );
      }
      (*(code *)ppEVar2)((Modder *)auStack_108,(Expression **)auStack_108);
    }
    Walker<Modder,_wasm::Visitor<Modder,_void>_>::~Walker
              ((Walker<Modder,_wasm::Visitor<Modder,_void>_> *)auStack_108);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::dropToLog(Function* func) {
  // Don't always do this.
  if (oneIn(2)) {
    return;
  }
  struct Modder : public PostWalker<Modder> {
    Module& wasm;
    TranslateToFuzzReader& parent;

    Modder(Module& wasm, TranslateToFuzzReader& parent)
      : wasm(wasm), parent(parent) {}

    void visitDrop(Drop* curr) {
      if (parent.isLoggableType(curr->value->type) && parent.oneIn(2)) {
        auto target = parent.logImportNames[curr->value->type];
        replaceCurrent(
          parent.builder.makeCall(target, {curr->value}, Type::none));
      }
    }
  };
  Modder modder(wasm, *this);
  modder.walk(func->body);
}